

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

void __thiscall FM::OPNBase::DataSave(OPNBase *this,OPNBaseData *data)

{
  OPNBaseData *data_local;
  OPNBase *this_local;
  
  Timer::DataSave(&this->super_Timer,&data->timer);
  data->fmvolume = this->fmvolume;
  data->clock = this->clock;
  data->rate = this->rate;
  data->psgrate = this->psgrate;
  data->status = this->status;
  data->prescale = this->prescale;
  Chip::DataSave(&this->chip,&data->chip);
  PSG::DataSave(&this->psg,&data->psg);
  return;
}

Assistant:

void OPNBase::DataSave(struct OPNBaseData* data) {
	Timer::DataSave(&data->timer);
	data->fmvolume = fmvolume;
	data->clock = clock;
	data->rate = rate;
	data->psgrate = psgrate;
	data->status = status;
	data->prescale = prescale;
	chip.DataSave(&data->chip);
	psg.DataSave(&data->psg);
}